

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O1

void __thiscall
IntBounds::SetBound<true>
          (IntBounds *this,int constantBoundBase,int offset,bool wasEstablishedExplicitly)

{
  bool bVar1;
  undefined8 in_RAX;
  int local_14 [2];
  int constantBound;
  
  local_14[0] = constantBoundBase;
  if ((((offset == 0) ||
       (local_14[0] = (int)((ulong)in_RAX >> 0x20),
       bVar1 = Int32Math::Add(constantBoundBase,offset,local_14), !bVar1)) &&
      (this->constantLowerBound < local_14[0])) && (local_14[0] <= this->constantUpperBound)) {
    this->constantLowerBound = local_14[0];
  }
  return;
}

Assistant:

void IntBounds::SetBound(const int constantBoundBase, const int offset, const bool wasEstablishedExplicitly)
{
    int constantBound;
    if(offset == 0)
        constantBound = constantBoundBase;
    else if(Int32Math::Add(constantBoundBase, offset, &constantBound))
        return;

    if(Lower)
        SetLowerBound(constantBound);
    else
        SetUpperBound(constantBound, wasEstablishedExplicitly);
}